

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_inplace_intersection(bitset_t *b1,bitset_t *b2)

{
  ulong local_28;
  size_t k;
  size_t minlength;
  bitset_t *b2_local;
  bitset_t *b1_local;
  
  if (b1->arraysize < b2->arraysize) {
    local_28 = b1->arraysize;
  }
  else {
    local_28 = b2->arraysize;
  }
  for (k = 0; k < local_28; k = k + 1) {
    b1->array[k] = b2->array[k] & b1->array[k];
  }
  for (; k < b1->arraysize; k = k + 1) {
    b1->array[k] = 0;
  }
  return;
}

Assistant:

void bitset_inplace_intersection(bitset_t *CBITSET_RESTRICT b1,
                                 const bitset_t *CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= b2->array[k];
    }
    for (; k < b1->arraysize; ++k) {
        b1->array[k] = 0;  // memset could, maybe, be a tiny bit faster
    }
}